

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall QFileSystemModel::sort(QFileSystemModel *this,int column,SortOrder order)

{
  bool bVar1;
  QFileSystemModelPrivate *__s;
  QModelIndex *this_00;
  type *ppQVar2;
  SortOrder in_EDX;
  int in_ESI;
  QFileSystemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  type *col;
  type *node;
  add_const_t<QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>_> *__range1_1;
  QModelIndex *oldNode;
  QModelIndexList *__range1;
  QFileSystemModelPrivate *d;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QModelIndexList newList;
  iterator __end1;
  iterator __begin1;
  QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> oldNodes;
  QModelIndexList oldList;
  QFileSystemModelPrivate *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  QList<QModelIndex> *in_stack_fffffffffffffec8;
  QFileSystemModelPrivate *parent;
  undefined1 local_108 [4];
  int in_stack_fffffffffffffefc;
  QFileSystemModelPrivate *in_stack_ffffffffffffff00;
  qsizetype in_stack_ffffffffffffff08;
  undefined1 local_f0 [32];
  const_iterator local_d0;
  const_iterator local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [24];
  QFileSystemModel local_90;
  int local_74;
  QFileSystemNode *local_70;
  QModelIndex *local_68;
  iterator local_60;
  iterator local_58;
  QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> local_50;
  QList<QModelIndex> local_38;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  parent = in_RDI;
  __s = d_func((QFileSystemModel *)0xaa70d8);
  if (((__s->sortOrder != in_EDX) || (__s->sortColumn != in_ESI)) || ((__s->forceSort & 1U) != 0)) {
    memset(local_20,0,0x18);
    QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0xaa7133);
    QAbstractItemModel::layoutAboutToBeChanged((QList_conflict3 *)in_RDI,(LayoutChangeHint)local_20)
    ;
    QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0xaa7154);
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemModel::persistentIndexList();
    local_50.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_50.d.ptr = (pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    local_50.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::QList
              ((QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *)0xaa71cd);
    QList<QModelIndex>::size(&local_38);
    QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::reserve
              ((QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *)
               in_stack_fffffffffffffec8,in_stack_ffffffffffffff08);
    local_58.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = QList<QModelIndex>::begin
                         ((QList<QModelIndex> *)
                          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    local_60.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_60 = QList<QModelIndex>::end
                         ((QList<QModelIndex> *)
                          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    while( true ) {
      local_68 = local_60.i;
      bVar1 = QList<QModelIndex>::iterator::operator!=(&local_58,local_60);
      if (!bVar1) break;
      this_00 = QList<QModelIndex>::iterator::operator*(&local_58);
      local_70 = QFileSystemModelPrivate::node
                           (in_RDI,(QModelIndex *)
                                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      local_74 = QModelIndex::column(this_00);
      QList<std::pair<QFileSystemModelPrivate::QFileSystemNode*,int>>::
      emplace_back<QFileSystemModelPrivate::QFileSystemNode*,int>
                ((QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (QFileSystemNode **)in_stack_fffffffffffffe98,(int *)0xaa72d9);
      QList<QModelIndex>::iterator::operator++(&local_58);
    }
    if (((__s->sortColumn != in_ESI) || (__s->sortOrder == in_EDX)) || ((__s->forceSort & 1U) != 0))
    {
      in_stack_fffffffffffffe98 = __s;
      in_stack_fffffffffffffea4 = in_ESI;
      rootPath((QFileSystemModel *)in_RDI);
      index(&local_90,(char *)in_RDI,(int)local_a8);
      QFileSystemModelPrivate::sortChildren
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,(QModelIndex *)parent);
      QString::~QString((QString *)0xaa737c);
      __s->sortColumn = in_ESI;
      __s->forceSort = false;
    }
    __s->sortOrder = in_EDX;
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::QList((QList<QModelIndex> *)0xaa73e0);
    QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::size(&local_50);
    QList<QModelIndex>::reserve(in_stack_fffffffffffffec8,in_stack_ffffffffffffff08);
    local_c8.i = (pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8 = QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::begin
                         ((QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *)
                          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    local_d0.i = (pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    local_d0 = QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::end
                         ((QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *)
                          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    while( true ) {
      local_f0._24_8_ = local_d0.i;
      bVar1 = QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::const_iterator::
              operator!=(&local_c8,local_d0);
      if (!bVar1) break;
      QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::const_iterator::operator*
                (&local_c8);
      ppQVar2 = std::get<0ul,QFileSystemModelPrivate::QFileSystemNode*,int>
                          ((pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *)0xaa74c3);
      std::get<1ul,QFileSystemModelPrivate::QFileSystemNode*,int>
                ((pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *)0xaa74e1);
      QFileSystemModelPrivate::index((QFileSystemModelPrivate *)local_f0,(char *)__s,(int)*ppQVar2);
      QList<QModelIndex>::append
                ((QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                 ,(rvalue_ref)in_stack_fffffffffffffe98);
      QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::const_iterator::operator++
                (&local_c8);
    }
    QAbstractItemModel::changePersistentIndexList
              ((QList_conflict3 *)in_RDI,(QList_conflict3 *)&local_38);
    memset(local_108,0,0x18);
    QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0xaa755d);
    QAbstractItemModel::layoutChanged((QList_conflict3 *)in_RDI,(LayoutChangeHint)local_108);
    QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0xaa757b);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0xaa7588);
    QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::~QList
              ((QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *)0xaa7595);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0xaa75a2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModel::sort(int column, Qt::SortOrder order)
{
    Q_D(QFileSystemModel);
    if (d->sortOrder == order && d->sortColumn == column && !d->forceSort)
        return;

    emit layoutAboutToBeChanged();
    QModelIndexList oldList = persistentIndexList();
    QList<std::pair<QFileSystemModelPrivate::QFileSystemNode *, int>> oldNodes;
    oldNodes.reserve(oldList.size());
    for (const QModelIndex &oldNode : oldList)
        oldNodes.emplace_back(d->node(oldNode), oldNode.column());

    if (!(d->sortColumn == column && d->sortOrder != order && !d->forceSort)) {
        //we sort only from where we are, don't need to sort all the model
        d->sortChildren(column, index(rootPath()));
        d->sortColumn = column;
        d->forceSort = false;
    }
    d->sortOrder = order;

    QModelIndexList newList;
    newList.reserve(oldNodes.size());
    for (const auto &[node, col]: std::as_const(oldNodes))
        newList.append(d->index(node, col));

    changePersistentIndexList(oldList, newList);
    emit layoutChanged({}, VerticalSortHint);
}